

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O0

extraction_status_t __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_dynamic_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::extract(mchain_template<so_5::mchain_props::details::limited_dynamic_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
          *this,demand_t *dest,select_case_t *select_case)

{
  bool bVar1;
  undefined1 local_38 [7];
  bool queue_empty;
  unique_lock<std::mutex> lock;
  select_case_t *select_case_local;
  demand_t *dest_local;
  mchain_template<so_5::mchain_props::details::limited_dynamic_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
  *this_local;
  
  lock._8_8_ = select_case;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_38,&this->m_lock);
  bVar1 = details::limited_dynamic_demand_queue::is_empty(&this->m_queue);
  if (bVar1) {
    if (this->m_status == closed) {
      this_local._4_4_ = chain_closed;
    }
    else {
      select_case_t::set_next((select_case_t *)lock._8_8_,this->m_select_tail);
      this->m_select_tail = (select_case_t *)lock._8_8_;
      this_local._4_4_ = no_messages;
    }
  }
  else {
    this_local._4_4_ = extract_demand_from_not_empty_queue(this,dest);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  return this_local._4_4_;
}

Assistant:

virtual extraction_status_t
		extract(
			demand_t & dest,
			select_case_t & select_case ) override
			{
				std::unique_lock< std::mutex > lock{ m_lock };

				const bool queue_empty = m_queue.is_empty();
				if( queue_empty )
					{
						if( details::status::closed == m_status )
							// There is no need to wait for something.
							return extraction_status_t::chain_closed;

						// In other cases select_tail must be modified.
						select_case.set_next( m_select_tail );
						m_select_tail = &select_case;

						return extraction_status_t::no_messages;
					}
				else
					return extract_demand_from_not_empty_queue( dest );
			}